

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::DoAddtlValueInstantiation_SnapES5ArrayInfo
               (SnapObject *snpObject,RecyclableObject *obj,InflateMap *inflator)

{
  SnapES5ArrayGetterSetterEntry *pSVar1;
  TTDVar pvVar2;
  SnapES5ArrayInfo *pSVar3;
  Var pvVar4;
  Var pvVar5;
  long lVar6;
  uint32 i;
  ulong uVar7;
  
  pSVar3 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapES5ArrayInfo*,(TTD::NSSnapObjects::SnapObjectType)22>
                     (snpObject);
  DoAddtlValueInstantiation_SnapArrayInfoCore<void*,void*>
            (pSVar3->BasicArrayData,(JavascriptArray *)obj,inflator);
  lVar6 = 0;
  for (uVar7 = 0; uVar7 < pSVar3->GetterSetterCount; uVar7 = uVar7 + 1) {
    pSVar1 = pSVar3->GetterSetterEntries;
    pvVar2 = *(TTDVar *)((long)&pSVar1->Getter + lVar6);
    if (pvVar2 == (TTDVar)0x0) {
      pvVar4 = (Var)0x0;
    }
    else {
      pvVar4 = InflateMap::InflateTTDVar(inflator,pvVar2);
    }
    pvVar2 = *(TTDVar *)((long)&pSVar1->Setter + lVar6);
    if (pvVar2 == (TTDVar)0x0) {
      pvVar5 = (Var)0x0;
    }
    else {
      pvVar5 = InflateMap::InflateTTDVar(inflator,pvVar2);
    }
    if (pvVar4 != (Var)0x0 || pvVar5 != (Var)0x0) {
      (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
        [0x6d])(obj,(ulong)*(uint *)((long)&pSVar1->Index + lVar6),pvVar4,pvVar5);
    }
    (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6c]
    )(obj,(ulong)*(uint *)((long)&pSVar1->Index + lVar6),(ulong)(&pSVar1->Attributes)[lVar6]);
    lVar6 = lVar6 + 0x18;
  }
  Js::JavascriptLibrary::SetLengthWritableES5Array_TTD(obj,pSVar3->IsLengthWritable);
  return;
}

Assistant:

void DoAddtlValueInstantiation_SnapES5ArrayInfo(const SnapObject* snpObject, Js::RecyclableObject* obj, InflateMap* inflator)
        {
            SnapES5ArrayInfo* es5Info = SnapObjectGetAddtlInfoAs<SnapES5ArrayInfo*, SnapObjectType::SnapES5ArrayObject>(snpObject);

            Js::JavascriptArray* arrayObj = static_cast<Js::JavascriptArray*>(obj);
            DoAddtlValueInstantiation_SnapArrayInfoCore<TTDVar, Js::Var>(es5Info->BasicArrayData, arrayObj, inflator);

            for(uint32 i = 0; i < es5Info->GetterSetterCount; ++i)
            {
                const SnapES5ArrayGetterSetterEntry* entry = es5Info->GetterSetterEntries + i;

                Js::Var getter = nullptr;
                if(entry->Getter != nullptr)
                {
                    getter = inflator->InflateTTDVar(entry->Getter);
                }

                Js::Var setter = nullptr;
                if(entry->Setter != nullptr)
                {
                    setter = inflator->InflateTTDVar(entry->Setter);
                }

                if(getter != nullptr || setter != nullptr)
                {
                    arrayObj->SetItemAccessors(entry->Index, getter, setter);
                }

                arrayObj->SetItemAttributes(entry->Index, entry->Attributes);
            }

            //do length writable as needed
            Js::JavascriptLibrary::SetLengthWritableES5Array_TTD(arrayObj, es5Info->IsLengthWritable);
        }